

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDebuggerVariables.cxx
# Opt level: O1

array<dap::Variable> * __thiscall
cmDebugger::cmDebuggerVariables::HandleVariablesRequest
          (array<dap::Variable> *__return_storage_ptr__,cmDebuggerVariables *this)

{
  pointer pcVar1;
  pointer pVVar2;
  pointer pVVar3;
  long lVar4;
  int iVar5;
  ulong uVar6;
  __normal_iterator<dap::Variable_*,_std::vector<dap::Variable,_std::allocator<dap::Variable>_>_>
  __i;
  string *psVar7;
  pointer pcVar8;
  pointer pVVar9;
  vector<cmDebugger::cmDebuggerVariableEntry,_std::allocator<cmDebugger::cmDebuggerVariableEntry>_>
  values;
  vector<cmDebugger::cmDebuggerVariableEntry,_std::allocator<cmDebugger::cmDebuggerVariableEntry>_>
  local_1b0;
  undefined1 local_198 [96];
  _Alloc_hider local_138;
  char local_128 [16];
  integer local_118;
  undefined8 uStack_110;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_108;
  bool local_f0;
  _Alloc_hider local_e8;
  char local_d8 [16];
  bool local_c8;
  optional<dap::boolean> local_c0;
  _Alloc_hider local_b8;
  char local_a8 [16];
  bool local_98;
  bool local_90;
  _Alloc_hider local_88;
  size_type sStack_80;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_78;
  undefined8 local_68;
  _Alloc_hider local_60;
  char local_50 [16];
  integer local_40;
  
  (__return_storage_ptr__->super__Vector_base<dap::Variable,_std::allocator<dap::Variable>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<dap::Variable,_std::allocator<dap::Variable>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<dap::Variable,_std::allocator<dap::Variable>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if ((this->GetKeyValuesFunction).super__Function_base._M_manager != (_Manager_type)0x0) {
    (*(this->GetKeyValuesFunction)._M_invoker)(&local_1b0,(_Any_data *)&this->GetKeyValuesFunction);
    if (local_1b0.
        super__Vector_base<cmDebugger::cmDebuggerVariableEntry,_std::allocator<cmDebugger::cmDebuggerVariableEntry>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_1b0.
        super__Vector_base<cmDebugger::cmDebuggerVariableEntry,_std::allocator<cmDebugger::cmDebuggerVariableEntry>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      psVar7 = &(local_1b0.
                 super__Vector_base<cmDebugger::cmDebuggerVariableEntry,_std::allocator<cmDebugger::cmDebuggerVariableEntry>_>
                 ._M_impl.super__Vector_impl_data._M_start)->Type;
      do {
        if (this->IgnoreEmptyStringEntries == true) {
          iVar5 = std::__cxx11::string::compare((char *)psVar7);
          if ((iVar5 != 0) || (psVar7[-1]._M_string_length != 0)) goto LAB_005596e4;
        }
        else {
LAB_005596e4:
          local_198._24_8_ = 0;
          local_198._8_8_ = 0;
          local_198._16_8_ = 0;
          local_198._32_8_ = 0;
          local_198._80_8_ = 0;
          local_198._40_8_ = 0;
          local_198._48_8_ = 0;
          local_198._56_8_ = local_198 + 0x48;
          local_198._64_8_ = 0;
          local_198._72_8_ = 0;
          local_198._88_8_ = 0;
          local_138._M_p = local_128;
          pcVar1 = (((cmDebuggerVariableEntry *)(psVar7 + -2))->Name)._M_dataplus._M_p;
          local_198._0_8_ = local_198 + 0x10;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_138,pcVar1,
                     pcVar1 + (((cmDebuggerVariableEntry *)(psVar7 + -2))->Name)._M_string_length);
          local_118.val = 0;
          uStack_110._0_1_ = false;
          uStack_110._1_7_ = 0;
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::vector(&local_108,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)(anonymous_namespace)::PrivateDataHint);
          local_f0 = (bool)(anonymous_namespace)::PrivateDataHint[0x18];
          local_e8._M_p = local_d8;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_e8,(anonymous_namespace)::PrivateDataHint._32_8_,
                     (anonymous_namespace)::PrivateDataHint._40_8_ +
                     (anonymous_namespace)::PrivateDataHint._32_8_);
          local_c8 = (bool)(anonymous_namespace)::PrivateDataHint[0x40];
          local_c0.val.val = (bool)(anonymous_namespace)::PrivateDataHint[0x48];
          local_c0.set = (bool)(anonymous_namespace)::PrivateDataHint[0x49];
          local_b8._M_p = local_a8;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_b8,(anonymous_namespace)::PrivateDataHint._80_8_,
                     (anonymous_namespace)::PrivateDataHint._88_8_ +
                     (anonymous_namespace)::PrivateDataHint._80_8_);
          local_98 = (bool)(anonymous_namespace)::PrivateDataHint[0x70];
          local_90 = true;
          if (this->SupportsVariableType == true) {
            local_88._M_p = (pointer)&local_78;
            pcVar1 = (psVar7->_M_dataplus)._M_p;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_88,pcVar1,pcVar1 + psVar7->_M_string_length);
            local_68._0_1_ = true;
          }
          else {
            local_78._8_8_ = 0;
            local_88._M_p = (pointer)&local_78;
            sStack_80 = 0;
            local_78._M_allocated_capacity = 0;
            local_68._0_1_ = false;
            local_68._1_7_ = 0;
          }
          local_60._M_p = local_50;
          pcVar1 = psVar7[-1]._M_dataplus._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_60,pcVar1,pcVar1 + psVar7[-1]._M_string_length);
          local_40.val = 0;
          std::vector<dap::Variable,_std::allocator<dap::Variable>_>::emplace_back<dap::Variable>
                    (__return_storage_ptr__,(Variable *)local_198);
          dap::Variable::~Variable((Variable *)local_198);
        }
        pcVar8 = (pointer)(psVar7 + 1);
        psVar7 = psVar7 + 3;
      } while (pcVar8 != local_1b0.
                         super__Vector_base<cmDebugger::cmDebuggerVariableEntry,_std::allocator<cmDebugger::cmDebuggerVariableEntry>_>
                         ._M_impl.super__Vector_impl_data._M_finish);
    }
    std::
    vector<cmDebugger::cmDebuggerVariableEntry,_std::allocator<cmDebugger::cmDebuggerVariableEntry>_>
    ::~vector(&local_1b0);
  }
  EnumerateSubVariablesIfAny(this,__return_storage_ptr__);
  if (this->EnableSorting == true) {
    pVVar2 = (__return_storage_ptr__->
             super__Vector_base<dap::Variable,_std::allocator<dap::Variable>_>)._M_impl.
             super__Vector_impl_data._M_start;
    pVVar3 = (__return_storage_ptr__->
             super__Vector_base<dap::Variable,_std::allocator<dap::Variable>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    if (pVVar2 != pVVar3) {
      uVar6 = ((long)pVVar3 - (long)pVVar2 >> 5) * 0x2e8ba2e8ba2e8ba3;
      lVar4 = 0x3f;
      if (uVar6 != 0) {
        for (; uVar6 >> lVar4 == 0; lVar4 = lVar4 + -1) {
        }
      }
      std::
      __introsort_loop<__gnu_cxx::__normal_iterator<dap::Variable*,std::vector<dap::Variable,std::allocator<dap::Variable>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<cmDebugger::cmDebuggerVariables::HandleVariablesRequest()::__0>>
                (pVVar2,pVVar3,((uint)lVar4 ^ 0x3f) * 2 ^ 0x7e);
      if ((long)pVVar3 - (long)pVVar2 < 0x1601) {
        std::
        __insertion_sort<__gnu_cxx::__normal_iterator<dap::Variable*,std::vector<dap::Variable,std::allocator<dap::Variable>>>,__gnu_cxx::__ops::_Iter_comp_iter<cmDebugger::cmDebuggerVariables::HandleVariablesRequest()::__0>>
                  (pVVar2,pVVar3);
      }
      else {
        pVVar9 = pVVar2 + 0x10;
        std::
        __insertion_sort<__gnu_cxx::__normal_iterator<dap::Variable*,std::vector<dap::Variable,std::allocator<dap::Variable>>>,__gnu_cxx::__ops::_Iter_comp_iter<cmDebugger::cmDebuggerVariables::HandleVariablesRequest()::__0>>
                  (pVVar2,pVVar9);
        for (; pVVar9 != pVVar3; pVVar9 = pVVar9 + 1) {
          std::
          __unguarded_linear_insert<__gnu_cxx::__normal_iterator<dap::Variable*,std::vector<dap::Variable,std::allocator<dap::Variable>>>,__gnu_cxx::__ops::_Val_comp_iter<cmDebugger::cmDebuggerVariables::HandleVariablesRequest()::__0>>
                    (pVVar9);
        }
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

dap::array<dap::Variable> cmDebuggerVariables::HandleVariablesRequest()
{
  dap::array<dap::Variable> variables;

  if (GetKeyValuesFunction != nullptr) {
    auto values = GetKeyValuesFunction();
    for (auto const& entry : values) {
      if (IgnoreEmptyStringEntries && entry.Type == "string" &&
          entry.Value.empty()) {
        continue;
      }
      variables.push_back(dap::Variable{
        {},
        {},
        {},
        entry.Name,
        {},
        PrivateDataHint,
        SupportsVariableType ? entry.Type : dap::optional<dap::string>(),
        entry.Value,
        0 });
    }
  }

  EnumerateSubVariablesIfAny(variables);

  if (EnableSorting) {
    std::sort(variables.begin(), variables.end(),
              [](dap::Variable const& a, dap::Variable const& b) {
                return a.name < b.name;
              });
  }
  return variables;
}